

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

float __thiscall
duckdb::VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,float>
          (VectorTryCastStrictOperator<duckdb::TryCast> *this,string_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  float *result;
  float fVar2;
  string_t input_00;
  string_t input_01;
  float output;
  float local_54;
  string local_50;
  
  input_01.value._0_8_ = input.value._0_8_;
  result = (float *)(ulong)*(byte *)(*(long *)(idx + 8) + 8);
  input_01.value.pointer.ptr = (char *)&local_54;
  bVar1 = TryCast::Operation<duckdb::string_t,float>((TryCast *)this,input_01,result,SUB81(idx,0));
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)result;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,float>(&local_50,(duckdb *)this,input_00);
    fVar2 = HandleVectorCastError::Operation<float>
                      (&local_50,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_54 = fVar2;
  }
  return local_54;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters.strict))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}